

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MemoryAlarm(_func_void_void_ptr_sqlite3_int64_int *xCallback,void *pArg,
                      sqlite3_int64 iThreshold)

{
  int iVar1;
  
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  mem0.alarmCallback = xCallback;
  mem0.alarmArg = pArg;
  mem0.alarmThreshold = iThreshold;
  mem0.nearlyFull = (int)(iThreshold <= sqlite3Stat.nowValue[0] && 0 < iThreshold);
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    iVar1 = (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    return iVar1;
  }
  return mem0.nearlyFull;
}

Assistant:

static int sqlite3MemoryAlarm(
  void(*xCallback)(void *pArg, sqlite3_int64 used,int N),
  void *pArg,
  sqlite3_int64 iThreshold
){
  int nUsed;
  sqlite3_mutex_enter(mem0.mutex);
  mem0.alarmCallback = xCallback;
  mem0.alarmArg = pArg;
  mem0.alarmThreshold = iThreshold;
  nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  mem0.nearlyFull = (iThreshold>0 && iThreshold<=nUsed);
  sqlite3_mutex_leave(mem0.mutex);
  return SQLITE_OK;
}